

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uint128.cpp
# Opt level: O1

void __thiscall UInt128_ShiftLeft_Test::~UInt128_ShiftLeft_Test(UInt128_ShiftLeft_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (UInt128, ShiftLeft) {
    EXPECT_EQ ((pstore::uint128{0x01U} << 0U), (pstore::uint128{0x01U}));
    EXPECT_EQ (pstore::uint128 (0x8000000000000000, 0x00) << 0U,
               pstore::uint128 (0x8000000000000000, 0x00));
    EXPECT_EQ ((pstore::uint128{0x01U} << 1U), (pstore::uint128{0x02U}));
    EXPECT_EQ (pstore::uint128 (0x4000000000000000, 0x00) << 1U,
               pstore::uint128 (0x8000000000000000, 0x00));
    EXPECT_EQ (pstore::uint128 (0x01, std::uint64_t{0x01} << 63) << 1U,
               pstore::uint128 (0x03, 0x00));
    EXPECT_EQ ((pstore::uint128{max64} << 64U), pstore::uint128 (max64, 0x00));
    EXPECT_EQ ((pstore::uint128{0x01U} << 127U), pstore::uint128 (std::uint64_t{0x01} << 63, 0x00));
}